

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QDBusListener::DBusKey>::moveAppend
          (QGenericArrayOps<QDBusListener::DBusKey> *this,DBusKey *b,DBusKey *e)

{
  DBusKey *pDVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  
  if ((b != e) && (b < e)) {
    pDVar1 = (this->super_QArrayDataPointer<QDBusListener::DBusKey>).ptr;
    qVar5 = (this->super_QArrayDataPointer<QDBusListener::DBusKey>).size;
    do {
      pDVar2 = (b->location).d.d;
      (b->location).d.d = (Data *)0x0;
      pDVar1[qVar5].location.d.d = pDVar2;
      pcVar3 = (b->location).d.ptr;
      (b->location).d.ptr = (char16_t *)0x0;
      pDVar1[qVar5].location.d.ptr = pcVar3;
      qVar4 = (b->location).d.size;
      (b->location).d.size = 0;
      pDVar1[qVar5].location.d.size = qVar4;
      pDVar2 = (b->key).d.d;
      (b->key).d.d = (Data *)0x0;
      pDVar1[qVar5].key.d.d = pDVar2;
      pcVar3 = (b->key).d.ptr;
      (b->key).d.ptr = (char16_t *)0x0;
      pDVar1[qVar5].key.d.ptr = pcVar3;
      qVar4 = (b->key).d.size;
      (b->key).d.size = 0;
      pDVar1[qVar5].key.d.size = qVar4;
      b = b + 1;
      qVar5 = (this->super_QArrayDataPointer<QDBusListener::DBusKey>).size + 1;
      (this->super_QArrayDataPointer<QDBusListener::DBusKey>).size = qVar5;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }